

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_fix_scramble(player *p)

{
  uint32_t *puVar1;
  ushort uVar2;
  long lVar3;
  int new_max [5];
  int new_cur [5];
  
  lVar3 = -10;
  while( true ) {
    if (lVar3 == 0) {
      for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
        p->stat_cur[lVar3] = (int16_t)new_cur[lVar3];
        p->stat_max[lVar3] = (int16_t)new_max[lVar3];
        p->stat_map[lVar3] = (int16_t)lVar3;
      }
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 1;
      return;
    }
    uVar2 = *(ushort *)((long)p->stat_map + lVar3 + 10);
    if (4 < uVar2) break;
    new_cur[uVar2] = (int)*(short *)((long)p->stat_map + lVar3);
    new_max[uVar2] = (int)*(short *)((long)p->stat_cur + lVar3);
    lVar3 = lVar3 + 2;
  }
  __assert_fail("p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-util.c"
                ,0x1a0,"void player_fix_scramble(struct player *)");
}

Assistant:

void player_fix_scramble(struct player *p)
{
	/* Figure out what stats should be */
	int new_cur[STAT_MAX];
	int new_max[STAT_MAX];
	int i;

	for (i = 0; i < STAT_MAX; ++i) {
		assert(p->stat_map[i] >= 0 && p->stat_map[i] < STAT_MAX);
		new_cur[p->stat_map[i]] = p->stat_cur[i];
		new_max[p->stat_map[i]] = p->stat_max[i];
	}

	/* Apply new stats and reset stat_map */
	for (i = 0; i < STAT_MAX; ++i) {
		p->stat_cur[i] = new_cur[i];
		p->stat_max[i] = new_max[i];
		p->stat_map[i] = i;
	}

	/* Mark what else needs to be updated */
	p->upkeep->update |= (PU_BONUS);
}